

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::min_max(NaVector *this,NaReal *vMin,NaReal *vMax)

{
  double dVar1;
  uint uVar2;
  double *in_RDX;
  double *in_RSI;
  long *in_RDI;
  uint i;
  uint local_1c;
  
  for (local_1c = 0; uVar2 = (**(code **)(*in_RDI + 0x30))(), local_1c < uVar2;
      local_1c = local_1c + 1) {
    if (local_1c == 0) {
      dVar1 = *(double *)in_RDI[2];
      *in_RDX = dVar1;
      *in_RSI = dVar1;
    }
    else {
      if (*(double *)(in_RDI[2] + (ulong)local_1c * 8) < *in_RSI) {
        *in_RSI = *(double *)(in_RDI[2] + (ulong)local_1c * 8);
      }
      dVar1 = *(double *)(in_RDI[2] + (ulong)local_1c * 8);
      if (*in_RDX <= dVar1 && dVar1 != *in_RDX) {
        *in_RDX = *(double *)(in_RDI[2] + (ulong)local_1c * 8);
      }
    }
  }
  return;
}

Assistant:

void
NaVector::min_max (NaReal& vMin, NaReal& vMax) const
{
    unsigned    i;
    for(i = 0; i < dim(); ++i){
        if(0 == i)
            vMin = vMax = pVect[i];
        else{
            if(pVect[i] < vMin)
                vMin = pVect[i];
            if(pVect[i] > vMax)
                vMax = pVect[i];
        }
    }
}